

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O1

trainType * __thiscall
sjtu::LRUCache<sjtu::trainType>::load(LRUCache<sjtu::trainType> *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  Node *pNVar4;
  CacheNode *this_00;
  CacheNode *pCVar5;
  CacheNode **ppCVar6;
  trainType ret;
  trainType local_a7c0;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar4 = pNVar1->left;
  if (pNVar4 != pNVar1) {
    do {
      lVar2 = pNVar4->value->first;
      if (lVar2 == *offset) break;
      pNVar4 = (&pNVar4->left)[lVar2 <= *offset];
    } while (pNVar4 != pNVar1);
  }
  if (pNVar4 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    this_00 = (CacheNode *)operator_new(0xa7d0);
    local_a7c0.startTime.month = 0;
    local_a7c0.startTime.day = 0;
    local_a7c0.startTime.hour = 0;
    local_a7c0.startTime.minute = 0;
    local_a7c0.saleDate[1].month = 0;
    local_a7c0.saleDate[1].day = 0;
    local_a7c0.saleDate[1].hour = 0;
    local_a7c0.saleDate[1].minute = 0;
    local_a7c0.saleDate[0].month = 0;
    local_a7c0.saleDate[0].day = 0;
    local_a7c0.saleDate[0].hour = 0;
    local_a7c0.saleDate[0].minute = 0;
    std::istream::seekg(this->file,*offset,0);
    std::istream::read((char *)this->file,(long)&local_a7c0);
    CacheNode::CacheNode(this_00,&local_a7c0,offset,this);
    if (this->block_lim == (this->table).tot) {
      pCVar5 = this->tail;
      pCVar3 = pCVar5->prec;
      this->tail = pCVar3;
      ppCVar6 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar6 = &this->head;
      }
      *ppCVar6 = (CacheNode *)0x0;
      if (pCVar5 != (CacheNode *)0x0) {
        CacheNode::~CacheNode(pCVar5);
        operator_delete(pCVar5,0xa7d0);
      }
    }
    pCVar5 = this->head;
    if (pCVar5 == (CacheNode *)0x0) {
      this->tail = this_00;
      goto LAB_001179d0;
    }
  }
  else {
    this_00 = pNVar4->value->second;
    pCVar5 = this->head;
    if (this_00 == pCVar5) {
      return &this_00->value;
    }
    pCVar3 = this_00->prec;
    pCVar3->succ = this_00->succ;
    ppCVar6 = &this_00->succ->prec;
    if (this_00->succ == (CacheNode *)0x0) {
      ppCVar6 = &this->tail;
    }
    *ppCVar6 = pCVar3;
    this_00->prec = (CacheNode *)0x0;
  }
  this_00->succ = pCVar5;
  pCVar5->prec = this_00;
LAB_001179d0:
  this->head = this_00;
  return &this_00->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}